

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  uint64_t uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  uVar1 = (ct->name).gcptr64;
  if (uVar1 == 0) {
    pcVar8 = ctr->pb;
    if (ctr->needsp != 0) {
      if (ctr->buf < pcVar8) {
        ctr->pb = pcVar8 + -1;
        pcVar8[-1] = ' ';
        pcVar8 = ctr->pb;
      }
      else {
        ctr->ok = 0;
      }
    }
    if (pcVar8 < ctr->buf + 0xb) {
      ctr->ok = 0;
    }
    else {
      uVar5 = (int)((ulong)((long)ct - (long)ctr->cts->tab) >> 3) * -0x55555555;
      do {
        pcVar8[-1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
        pcVar8 = pcVar8 + -1;
        bVar2 = 9 < uVar5;
        uVar5 = uVar5 / 10;
      } while (bVar2);
      ctr->pb = pcVar8;
    }
    ctr->needsp = 1;
  }
  else {
    uVar3 = (ulong)*(uint *)(uVar1 + 0x14);
    pcVar8 = ctr->pb;
    if (pcVar8 < ctr->buf + uVar3 + 1) {
      ctr->ok = 0;
    }
    else {
      pcVar7 = pcVar8;
      if (ctr->needsp != 0) {
        pcVar8[-1] = ' ';
        pcVar7 = pcVar8 + -1;
      }
      ctr->needsp = 1;
      pcVar8 = pcVar7 + -uVar3;
      if (uVar3 != 0) {
        lVar6 = 0;
        do {
          pcVar7[lVar6 + -1] = *(char *)(uVar1 + uVar3 + 0x17 + lVar6);
          lVar6 = lVar6 + -1;
        } while (-lVar6 != uVar3);
      }
      ctr->pb = pcVar8;
    }
  }
  sVar4 = strlen(t);
  uVar3 = sVar4 & 0xffffffff;
  if (pcVar8 < ctr->buf + uVar3 + 1) {
    ctr->ok = 0;
  }
  else {
    if (ctr->needsp != 0) {
      pcVar8[-1] = ' ';
      pcVar8 = pcVar8 + -1;
    }
    ctr->needsp = 1;
    if (uVar3 != 0) {
      lVar6 = 0;
      do {
        pcVar8[lVar6 + -1] = t[lVar6 + (uVar3 - 1)];
        lVar6 = lVar6 + -1;
      } while (-lVar6 != uVar3);
    }
    ctr->pb = pcVar8 + -uVar3;
  }
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}